

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSerializeEngine.cpp
# Opt level: O2

XSerializeEngine * __thiscall
xercesc_4_0::XSerializeEngine::operator<<(XSerializeEngine *this,short sh)

{
  short *psVar1;
  
  checkAndFlushBuffer(this,(ulong)((uint)this->fBufCur & 1) | 2);
  alignBufCur(this,2);
  psVar1 = (short *)this->fBufCur;
  *psVar1 = sh;
  this->fBufCur = (XMLByte *)(psVar1 + 1);
  return this;
}

Assistant:

XSerializeEngine& XSerializeEngine::operator<<(short sh)
{
    checkAndFlushBuffer(calBytesNeeded(sizeof(short)));

    alignBufCur(sizeof(short));
    *reinterpret_cast<short*>(fBufCur) = sh;
    fBufCur += sizeof(short);
    return *this;
}